

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QByteArray>::reallocate
          (QMovableArrayOps<QByteArray> *this,qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QByteArray>_*,_QByteArray_*> pVar2;
  pair<QTypedArrayData<QByteArray>_*,_QByteArray_*> pair;
  QByteArray *pQStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QByteArray>::reallocateUnaligned
                    ((QTypedArrayData<QByteArray> *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,in_RSI,in_EDX);
  qt_noop();
  (in_RDI->d).d = (Data *)pVar2.first;
  pQStack_10 = pVar2.second;
  (in_RDI->d).ptr = (char *)pQStack_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }